

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

recursive_directory_iterator * __thiscall
ghc::filesystem::recursive_directory_iterator::operator=
          (recursive_directory_iterator *this,recursive_directory_iterator *rhs)

{
  recursive_directory_iterator *rhs_local;
  recursive_directory_iterator *this_local;
  
  std::shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl>
  ::operator=(&this->_impl,&rhs->_impl);
  return this;
}

Assistant:

GHC_INLINE recursive_directory_iterator& recursive_directory_iterator::operator=(recursive_directory_iterator&& rhs) noexcept
{
    _impl = std::move(rhs._impl);
    return *this;
}